

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O3

void __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
::set_main_font(list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
                *this,shared_ptr<dlib::font> *f)

{
  data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
  *pdVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  ulong uVar4;
  auto_mutex M;
  auto_mutex local_30;
  
  local_30.r = (this->super_scrollable_region).super_drawable.m;
  local_30.m = (mutex *)0x0;
  local_30.rw = (read_write_mutex *)0x0;
  rmutex::lock(local_30.r,1);
  (this->super_scrollable_region).super_drawable.mfont.
  super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (f->super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_scrollable_region).super_drawable.mfont.
              super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(f->super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  if ((this->items).array_size != 0) {
    lVar3 = 0x30;
    uVar4 = 0;
    do {
      pdVar1 = (this->items).array_elements;
      font::compute_size<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>
                ((this->super_scrollable_region).super_drawable.mfont.
                 super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)((long)pdVar1 + lVar3 + -0x30),(unsigned_long *)((long)pdVar1 + lVar3 + -8),
                 (unsigned_long *)((long)&(pdVar1->name)._M_dataplus._M_p + lVar3),0,
                 0xffffffffffffffff);
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x38;
    } while (uVar4 < (this->items).array_size);
  }
  iVar2 = (*((this->super_scrollable_region).super_drawable.mfont.
             super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_font[4])();
  scrollable_region::set_vertical_scroll_increment
            (&this->super_scrollable_region,CONCAT44(extraout_var,iVar2));
  base_window::invalidate_rectangle
            (&((this->super_scrollable_region).super_drawable.parent)->super_base_window,
             &(this->super_scrollable_region).super_drawable.rect);
  auto_mutex::unlock(&local_30);
  return;
}

Assistant:

void list_box<S>::
    set_main_font (
        const std::shared_ptr<font>& f
    )
    {
        auto_mutex M(m);
        mfont = f;
        // recompute the sizes of all the items
        for (unsigned long i = 0; i < items.size(); ++i)
        {
            mfont->compute_size(items[i].name,items[i].width, items[i].height);
        }
        set_vertical_scroll_increment(mfont->height());
        parent.invalidate_rectangle(rect);
    }